

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O0

KeyData * cfd::capi::ParsePubkey(int kind,char *pubkey,NetType net_type)

{
  NetType NVar1;
  long lVar2;
  CfdException *this;
  undefined8 uVar3;
  int in_ECX;
  char *in_RDX;
  int in_ESI;
  KeyData *in_RDI;
  bool bVar4;
  bool has_mainnet;
  bool is_pubkey;
  bool has_extpubkey;
  string pubkey_str;
  size_t kCompressPubkeyHexSize;
  KeyData *data;
  KeyData *in_stack_fffffffffffffa30;
  allocator *paVar5;
  string *in_stack_fffffffffffffa40;
  undefined8 in_stack_fffffffffffffa48;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffa50;
  allocator local_571;
  string local_570 [32];
  CfdSourceLocation local_550;
  ExtPubkey local_538;
  undefined1 local_4c1;
  ByteData local_4c0;
  string local_4a1;
  ExtPubkey local_480;
  KeyData local_410;
  ByteData local_2c0;
  allocator local_2a1;
  string local_2a0;
  ByteData local_280;
  ExtPubkey local_268;
  KeyData local_1f8;
  undefined1 local_a1;
  undefined4 local_a0;
  undefined1 local_9a;
  allocator local_99;
  string local_98 [32];
  CfdSourceLocation local_78;
  byte local_5e;
  byte local_5d;
  allocator local_49;
  string local_48;
  undefined8 local_28;
  int local_1c;
  int local_c;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffa48 >> 0x20);
  local_28 = 0x42;
  local_1c = in_ECX;
  local_c = in_ESI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,in_RDX,&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_5d = 0;
  if ((2 < local_c - 1U) && (local_c == 4)) {
    local_5d = 1;
  }
  local_5e = 0;
  lVar2 = std::__cxx11::string::length();
  if (lVar2 == 0x42) {
    local_5e = 1;
  }
  if ((local_5e & 1) != (local_5d & 1)) {
    if ((local_5e & 1) == 0) {
      local_a1 = 0;
      core::KeyData::KeyData(in_RDI);
      lVar2 = std::__cxx11::string::length();
      if (lVar2 == 0x9c) {
        core::ByteData::ByteData(&local_280,&local_48);
        core::ExtPubkey::ExtPubkey(&local_268,&local_280);
        paVar5 = &local_2a1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_2a0,"",paVar5);
        error_code = (CfdError)((ulong)paVar5 >> 0x20);
        core::ByteData::ByteData(&local_2c0);
        core::KeyData::KeyData(&local_1f8,&local_268,&local_2a0,&local_2c0);
        core::KeyData::operator=(in_RDI,&local_1f8);
        core::KeyData::~KeyData(in_stack_fffffffffffffa30);
        core::ByteData::~ByteData((ByteData *)0x5f7897);
        std::__cxx11::string::~string((string *)&local_2a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
        core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_fffffffffffffa30);
        core::ByteData::~ByteData((ByteData *)0x5f78cb);
      }
      else {
        core::ExtPubkey::ExtPubkey(&local_480,&local_48);
        in_stack_fffffffffffffa40 = &local_4a1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_4a1.field_0x1,"",(allocator *)in_stack_fffffffffffffa40);
        core::ByteData::ByteData(&local_4c0);
        core::KeyData::KeyData(&local_410,&local_480,(string *)&local_4a1.field_0x1,&local_4c0);
        core::KeyData::operator=(in_RDI,&local_410);
        core::KeyData::~KeyData(in_stack_fffffffffffffa30);
        core::ByteData::~ByteData((ByteData *)0x5f7a2b);
        std::__cxx11::string::~string((string *)&local_4a1.field_0x1);
        std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
        core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_fffffffffffffa30);
      }
      core::KeyData::GetExtPubkey(&local_538,in_RDI);
      NVar1 = core::ExtPubkey::GetNetworkType(&local_538);
      bVar4 = NVar1 == kMainnet;
      core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_fffffffffffffa30);
      local_4c1 = bVar4;
      if (((local_1c == 0) && (!bVar4)) || ((local_1c != 0 && (bVar4)))) {
        local_550.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                     ,0x2f);
        local_550.filename = local_550.filename + 1;
        local_550.line = 0xb9;
        local_550.funcname = "ParsePubkey";
        core::logger::warn<>(&local_550,"unmatch xpubkey network type.");
        uVar3 = __cxa_allocate_exception(0x30);
        paVar5 = &local_571;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_570,"Failed to parameter. unmatch xpubkey network type.",paVar5);
        core::CfdException::CfdException
                  (in_stack_fffffffffffffa50,error_code,in_stack_fffffffffffffa40);
        __cxa_throw(uVar3,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      local_a1 = 1;
    }
    else {
      core::KeyData::KeyData(in_RDI,&local_48,-1,false);
    }
    local_a0 = 1;
    std::__cxx11::string::~string((string *)&local_48);
    return in_RDI;
  }
  local_78.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
               ,0x2f);
  local_78.filename = local_78.filename + 1;
  local_78.line = 0xa5;
  local_78.funcname = "ParsePubkey";
  core::logger::warn<>(&local_78,"unmatch pubkey type.");
  local_9a = 1;
  this = (CfdException *)__cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"Failed to parameter. unmatch pubkey type.",&local_99);
  core::CfdException::CfdException(this,error_code,in_stack_fffffffffffffa40);
  local_9a = 0;
  __cxa_throw(this,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

static KeyData ParsePubkey(int kind, const char* pubkey, NetType net_type) {
  constexpr size_t kCompressPubkeyHexSize = Pubkey::kCompressedPubkeySize * 2;
  std::string pubkey_str(pubkey);

  bool has_extpubkey = false;
  switch (kind) {
    case kCfdPsbtRecordGloalXpub:
      has_extpubkey = true;
      break;
    case kCfdPsbtRecordInputBip32:
    case kCfdPsbtRecordInputSignature:
    case kCfdPsbtRecordOutputBip32:
    default:
      break;
  }

  bool is_pubkey = false;
  if (pubkey_str.length() == kCompressPubkeyHexSize) {
    is_pubkey = true;
  }
  if (is_pubkey == has_extpubkey) {
    warn(CFD_LOG_SOURCE, "unmatch pubkey type.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to parameter. unmatch pubkey type.");
  }

  if (is_pubkey) {
    return KeyData(pubkey_str);
  }
  KeyData data;
  if (pubkey_str.length() == kCfdExtPubkeyHexSize) {
    data = KeyData(ExtPubkey(ByteData(pubkey_str)), "", ByteData());
  } else {
    data = KeyData(ExtPubkey(pubkey_str), "", ByteData());
  }
  bool has_mainnet =
      (data.GetExtPubkey().GetNetworkType() == NetType::kMainnet);

  if (((net_type == NetType::kMainnet) && (!has_mainnet)) ||
      ((net_type != NetType::kMainnet) && (has_mainnet))) {
    warn(CFD_LOG_SOURCE, "unmatch xpubkey network type.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to parameter. unmatch xpubkey network type.");
  }
  return data;
}